

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void SimpleVFilter16_C(uint8_t *p,int stride,int thresh)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = (long)stride;
  lVar6 = 0x10;
  do {
    bVar1 = p[-lVar5];
    bVar2 = *p;
    if ((int)((uint)abs0[((ulong)p[lVar5 * -2] - (ulong)p[lVar5]) + 0xff] +
             (uint)abs0[((ulong)bVar1 - (ulong)bVar2) + 0xff] * 4) <= thresh * 2 + 1) {
      iVar4 = ((uint)bVar2 - (uint)bVar1) * 3;
      uVar3 = sclip2[(long)((char)sclip1[((ulong)p[lVar5 * -2] - (ulong)p[lVar5]) + 0x3fc] + iVar4 +
                            4 >> 3) + 0x70];
      p[-lVar5] = ""[(ulong)(uint)bVar1 +
                     (long)(char)sclip2[(long)((char)sclip1[((ulong)p[lVar5 * -2] - (ulong)p[lVar5])
                                                            + 0x3fc] + iVar4 + 3 >> 3) + 0x70] +
                     0xff];
      *p = ""[((ulong)bVar2 - (long)(char)uVar3) + 0xff];
    }
    p = p + 1;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  return;
}

Assistant:

static void SimpleVFilter16_C(uint8_t* p, int stride, int thresh) {
  int i;
  const int thresh2 = 2 * thresh + 1;
  for (i = 0; i < 16; ++i) {
    if (NeedsFilter_C(p + i, stride, thresh2)) {
      DoFilter2_C(p + i, stride);
    }
  }
}